

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

SockData * AGSSock::recvfrom_impl<AGSSock::SockData>(Socket *sock,SockAddr *addr)

{
  size_t count;
  int *piVar1;
  long ret;
  char acStack_10028 [4];
  socklen_t addrlen;
  char buffer [65536];
  SockAddr *addr_local;
  Socket *sock_local;
  
  ret._4_4_ = 0x80;
  count = recvfrom(sock->id,acStack_10028,0xffff,0,(sockaddr *)addr,(socklen_t *)((long)&ret + 4));
  piVar1 = __errno_location();
  sock->error = *piVar1;
  if (count == 0xffffffffffffffff) {
    sock_local = (Socket *)0x0;
  }
  else {
    sock_local = (Socket *)recvfrom_return<AGSSock::SockData>(acStack_10028,count);
  }
  return (SockData *)sock_local;
}

Assistant:

inline T *recvfrom_impl(Socket *sock, SockAddr *addr)
{
	char buffer[65536];
	buffer[sizeof (buffer) - 1] = 0;

	ADDRLEN addrlen = sizeof (SockAddr);
	long ret = recvfrom(sock->id, buffer, sizeof (buffer) - 1, 0,
		ADDR(addr), &addrlen);
	sock->error = GET_ERROR();
	
	if (ret == SOCKET_ERROR)
		return nullptr;
	
	return recvfrom_return<T>(buffer, ret);
}